

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::VarScope::merge(VarScope *this,VarScope *other)

{
  ValueRef *other_00;
  iterator iVar1;
  mapped_type *ppVVar2;
  int iVar3;
  VarScope *pVVar4;
  VarScope *pVVar5;
  _Hash_node_base *p_Var6;
  
  pVVar4 = this;
  pVVar5 = other;
  do {
    p_Var6 = (pVVar5->symbols)._M_h._M_before_begin._M_nxt;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      do {
        iVar1 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pVVar4->symbols)._M_h,(key_type *)(p_Var6 + 1));
        other_00 = (ValueRef *)p_Var6[2]._M_nxt;
        if (iVar1.
            super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (other_00->info->kind == SK_VAR) {
            other_00->state = VRS_PARTIALLY;
            other_00->expression = (Expr *)0x0;
          }
          other_00->flagsPositive = 0;
          other_00->flagsNegative = 0;
          (other_00->upperBound).kind = VBK_UNKNOWN;
          (other_00->lowerBound).kind = VBK_UNKNOWN;
          ppVVar2 = std::__detail::
                    _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pVVar4->symbols,(key_type *)(p_Var6 + 1));
          *ppVVar2 = other_00;
        }
        else if (other_00->info ==
                 (*(ValueRef **)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                          ._M_cur + 0x10))->info) {
          ValueRef::merge(*(ValueRef **)
                           ((long)iVar1.
                                  super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                                  ._M_cur + 0x10),other_00);
        }
        p_Var6 = p_Var6->_M_nxt;
      } while (p_Var6 != (_Hash_node_base *)0x0);
    }
    pVVar4 = pVVar4->parent;
    pVVar5 = pVVar5->parent;
  } while (pVVar4 != (VarScope *)0x0);
  iVar3 = other->evalId;
  if (other->evalId < this->evalId) {
    iVar3 = this->evalId;
  }
  this->evalId = iVar3 + 1;
  return;
}

Assistant:

void VarScope::merge(const VarScope *other) {
  VarScope *l = this;
  const VarScope *r = other;

  while (l) {
    assert(l->depth == r->depth && "Scope corruption");
    assert(l->owner == r->owner && "Scope corruption");

    auto &thisSymbols = l->symbols;
    auto &otherSymbols = r->symbols;
    auto it = otherSymbols.begin();
    auto ie = otherSymbols.end();
    auto te = thisSymbols.end();

    while (it != ie) {
      auto f = thisSymbols.find(it->first);
      if (f != te) {
        if (it->second->info == f->second->info) // lambdas declared on the same line could have same names
          f->second->merge(it->second);
      }
      else {
        it->second->kill(VRS_PARTIALLY);
        thisSymbols[it->first] = it->second;
      }
      ++it;
    }

    l = l->parent;
    r = r->parent;
  }

  evalId = std::max(evalId, other->evalId) + 1;
}